

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes1.cc
# Opt level: O0

int __thiscall Node::IsLogical(Node *this)

{
  int iVar1;
  Node *this_local;
  
  iVar1 = this->Type;
  if (iVar1 == 0x28) {
    this_local._4_4_ = IsLogical(this->Tree[0]);
  }
  else if ((iVar1 - 0x3cU < 3) || (iVar1 - 0x1e2U < 6)) {
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Node::IsLogical(void)
{
	switch(Type)
	{
	case '<':
	case '>':
	case BAS_X_NEQ:
	case BAS_X_GE:
	case BAS_X_LE:
	case '=':
	case BAS_X_LNOT:
	case BAS_X_LAND:
	case BAS_X_LOR:
		//
		// logical operations
		//
		return 1;

	case '(':
		//
		// Look beneath the skin
		//
		return Tree[0]->IsLogical();

	default:
		//
		// By default, things are not logical
		//
		return 0;
	}
}